

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::OptConstFoldBinaryWasm<long>
          (GlobOpt *this,Instr **pInstr,Value *src1,Value *src2,Value **pDstVal)

{
  Instr *pIVar1;
  bool bVar2;
  bool bVar3;
  JITTimeFunctionBody *this_00;
  Opnd *this_01;
  RegOpnd *dst;
  long local_50;
  long src1IntConstantValue;
  long src2IntConstantValue;
  int64 tmpValueOut;
  
  bVar2 = DoConstFold(this);
  if ((bVar2) && (src1 != (Value *)0x0)) {
    bVar3 = ValueInfo::TryGetIntConstantValue(src1->valueInfo,&local_50,false);
    bVar2 = false;
    if ((src2 != (Value *)0x0) && (bVar2 = false, bVar3)) {
      bVar2 = false;
      bVar3 = ValueInfo::TryGetIntConstantValue(src2->valueInfo,&src1IntConstantValue,false);
      if (bVar3) {
        pIVar1 = *pInstr;
        tmpValueOut = src1IntConstantValue;
        this_00 = Func::GetJITFunctionBody(this->func);
        bVar2 = JITTimeFunctionBody::IsWasmFunction(this_00);
        bVar2 = IR::Instr::BinaryCalculatorT<long>
                          (pIVar1,local_50,tmpValueOut,&src2IntConstantValue,bVar2);
        if (bVar2) {
          CaptureByteCodeSymUses(this,*pInstr);
          bVar3 = IR::Opnd::IsInt64((*pInstr)->m_dst);
          if (bVar3) {
            this_01 = ReplaceWConst<long>(this,pInstr,src2IntConstantValue,pDstVal);
          }
          else {
            this_01 = ReplaceWConst<int>(this,pInstr,(int)src2IntConstantValue,pDstVal);
          }
          pIVar1 = *pInstr;
          pIVar1->m_opcode = Ld_I4;
          dst = IR::Opnd::AsRegOpnd(this_01);
          ToInt32Dst(this,pIVar1,dst,this->currentBlock);
        }
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool GlobOpt::OptConstFoldBinaryWasm(
    IR::Instr** pInstr,
    const Value* src1,
    const Value* src2,
    Value **pDstVal)
{
    IR::Instr* &instr = *pInstr;

    if (!DoConstFold())
    {
        return false;
    }

    T src1IntConstantValue, src2IntConstantValue;
    if (!src1 || !src1->GetValueInfo()->TryGetIntConstantValue(&src1IntConstantValue, false) || //a bit sketchy: false for int32 means likelyInt = false
        !src2 || !src2->GetValueInfo()->TryGetIntConstantValue(&src2IntConstantValue, false)    //and unsigned = false for int64
        )
    {
        return false;
    }

    int64 tmpValueOut;
    if (!instr->BinaryCalculatorT<T>(src1IntConstantValue, src2IntConstantValue, &tmpValueOut, func->GetJITFunctionBody()->IsWasmFunction()))
    {
        return false;
    }

    this->CaptureByteCodeSymUses(instr);

    IR::Opnd *dst = (instr->GetDst()->IsInt64()) ? //dst can be int32 for int64 comparison operators
        ReplaceWConst(pInstr, tmpValueOut, pDstVal) :
        ReplaceWConst(pInstr, (int)tmpValueOut, pDstVal);

    instr->m_opcode = Js::OpCode::Ld_I4;
    this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);
    return true;
}